

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

char * helicsFilterGetInfo(HelicsFilter filt)

{
  FilterObject *pFVar1;
  string *info;
  FilterObject *filtObj;
  Interface *in_stack_ffffffffffffffd0;
  HelicsFilter in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  pFVar1 = anon_unknown.dwarf_88686::getFilterObj
                     (in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (pFVar1 == (FilterObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  else {
    helics::Interface::getInfo_abi_cxx11_(in_stack_ffffffffffffffd0);
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

const char* helicsFilterGetInfo(HelicsFilter filt)
{
    auto* filtObj = getFilterObj(filt, nullptr);
    if (filtObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = filtObj->filtPtr->getInfo();
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}